

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O1

size_t release_unused_segments(mstate m)

{
  malloc_segment *pmVar1;
  ulong uVar2;
  size_t __len;
  malloc_tree_chunk *pmVar3;
  char *pcVar4;
  malloc_tree_chunk *pmVar5;
  int iVar6;
  malloc_tree_chunk **ppmVar7;
  malloc_tree_chunk *pmVar8;
  tbinptr pmVar9;
  uint uVar10;
  malloc_segment *pmVar11;
  long lVar12;
  ulong uVar13;
  tbinptr pmVar14;
  byte bVar15;
  char *pcVar16;
  malloc_segment *pmVar17;
  malloc_segment *pmVar18;
  uint uVar19;
  uint uVar20;
  size_t local_40;
  
  if (_gm_.seg.next == (malloc_segment *)0x0) {
    uVar19 = 0;
    local_40 = 0;
LAB_00105f81:
    _gm_.release_checks = 0xfff;
    if (0xfff < uVar19) {
      _gm_.release_checks = (size_t)uVar19;
    }
    return local_40;
  }
  local_40 = 0;
  uVar19 = 0;
  pmVar11 = _gm_.seg.next;
  pmVar17 = &_gm_.seg;
LAB_00105c49:
  pmVar1 = pmVar11->next;
  pmVar18 = pmVar11;
  if ((pmVar11->sflags & 9) == 1) {
    pcVar16 = pmVar11->base;
    uVar13 = (ulong)(-(int)pcVar16 - 0x10U & 0xf);
    uVar2 = *(ulong *)(pcVar16 + uVar13 + 8);
    if (((uint)uVar2 & 3) != 1) goto LAB_00105ce8;
    __len = pmVar11->size;
    pmVar14 = (tbinptr)(pcVar16 + uVar13);
    uVar13 = uVar2 & 0xfffffffffffffff8;
    if ((char *)((long)&pmVar14->prev_foot + uVar13) < pcVar16 + (__len - 0x50)) goto LAB_00105ce8;
    if (pmVar14 != (tbinptr)_gm_.dv) {
      pmVar9 = pmVar14->bk;
      pmVar8 = pmVar14->parent;
      if (pmVar9 == pmVar14) {
        pmVar9 = pmVar14->child[1];
        if (pmVar9 != (tbinptr)0x0) {
          ppmVar7 = pmVar14->child + 1;
LAB_00105d3a:
          do {
            if (pmVar9->child[1] == (malloc_tree_chunk *)0x0) {
              if (pmVar9->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00105d4e;
              ppmVar7 = pmVar9->child;
            }
            else {
              ppmVar7 = pmVar9->child + 1;
            }
            pmVar9 = *ppmVar7;
          } while( true );
        }
        pmVar9 = pmVar14->child[0];
        if (pmVar9 != (tbinptr)0x0) {
          ppmVar7 = pmVar14->child;
          goto LAB_00105d3a;
        }
        pmVar9 = (tbinptr)0x0;
      }
      else {
        pmVar3 = pmVar14->fd;
        if (((pmVar3 < _gm_.least_addr) || (pmVar3->bk != pmVar14)) || (pmVar9->fd != pmVar14))
        goto LAB_00105fac;
        pmVar3->bk = pmVar9;
        pmVar9->fd = pmVar3;
      }
      goto LAB_00105d62;
    }
    _gm_.dv = (mchunkptr)0x0;
    _gm_.dvsize = 0;
    goto LAB_00105e01;
  }
  goto LAB_00105ce8;
code_r0x00105d4e:
  if (ppmVar7 < _gm_.least_addr) goto LAB_00105fac;
  *ppmVar7 = (malloc_tree_chunk *)0x0;
LAB_00105d62:
  if (pmVar8 == (malloc_tree_chunk *)0x0) goto LAB_00105e01;
  uVar20 = pmVar14->index;
  if (pmVar14 == _gm_.treebins[uVar20]) {
    _gm_.treebins[uVar20] = pmVar9;
    if (pmVar9 == (tbinptr)0x0) {
      bVar15 = (byte)uVar20 & 0x1f;
      _gm_.treemap = _gm_.treemap & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15);
      goto LAB_00105db4;
    }
  }
  else {
    if (pmVar8 < _gm_.least_addr) goto LAB_00105fac;
    if (pmVar8->child[0] == pmVar14) {
      pmVar8->child[0] = pmVar9;
    }
    else {
      pmVar8->child[1] = pmVar9;
    }
LAB_00105db4:
    if (pmVar9 == (tbinptr)0x0) goto LAB_00105e01;
  }
  pcVar4 = _gm_.least_addr;
  if (pmVar9 < _gm_.least_addr) {
LAB_00105fac:
    abort();
  }
  pmVar9->parent = pmVar8;
  pmVar8 = pmVar14->child[0];
  if (pmVar8 != (malloc_tree_chunk *)0x0) {
    if (pmVar8 < pcVar4) goto LAB_00105fac;
    pmVar9->child[0] = pmVar8;
    pmVar8->parent = pmVar9;
  }
  pmVar8 = pmVar14->child[1];
  if (pmVar8 != (malloc_tree_chunk *)0x0) {
    if (pmVar8 < pcVar4) goto LAB_00105fac;
    pmVar9->child[1] = pmVar8;
    pmVar8->parent = pmVar9;
  }
LAB_00105e01:
  iVar6 = munmap(pcVar16,__len);
  if (iVar6 == 0) {
    local_40 = local_40 + __len;
    _gm_.footprint = _gm_.footprint - __len;
    pmVar17->next = pmVar1;
    pmVar18 = pmVar17;
  }
  else {
    uVar20 = (uint)(uVar2 >> 8);
    if (uVar20 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0x1f;
      if (uVar20 < 0x10000) {
        uVar10 = 0x1f;
        if (uVar20 != 0) {
          for (; uVar20 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        uVar10 = (uint)((uVar13 >> ((ulong)(byte)(0x26 - (char)(uVar10 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar10 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar8 = (malloc_tree_chunk *)(_gm_.treebins + uVar10);
    pmVar14->index = uVar10;
    pmVar14->child[0] = (malloc_tree_chunk *)0x0;
    pmVar14->child[1] = (malloc_tree_chunk *)0x0;
    if ((_gm_.treemap >> (uVar10 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar10 & 0x1f);
      pmVar8->prev_foot = (size_t)pmVar14;
      pmVar14->parent = pmVar8;
      pmVar14->bk = pmVar14;
      pmVar14->fd = pmVar14;
    }
    else {
      pmVar8 = (malloc_tree_chunk *)pmVar8->prev_foot;
      bVar15 = 0x39 - (char)(uVar10 >> 1);
      if (uVar10 == 0x1f) {
        bVar15 = 0;
      }
      lVar12 = uVar13 << (bVar15 & 0x3f);
      do {
        if ((pmVar8->head & 0xfffffffffffffff8) == uVar13) {
          if ((pmVar8 < _gm_.least_addr) || (pmVar3 = pmVar8->fd, pmVar3 < _gm_.least_addr))
          goto LAB_00105fac;
          pmVar3->bk = pmVar14;
          pmVar8->fd = pmVar14;
          pmVar14->fd = pmVar3;
          pmVar14->bk = pmVar8;
          pmVar14->parent = (malloc_tree_chunk *)0x0;
          break;
        }
        pmVar3 = *(malloc_tree_chunk **)((long)pmVar8 + (lVar12 >> 0x3f) * -8 + 0x20);
        pmVar5 = pmVar3;
        if (pmVar3 == (malloc_tree_chunk *)0x0) {
          pcVar16 = (char *)((long)pmVar8 + (lVar12 >> 0x3f) * -8 + 0x20);
          if (pcVar16 < _gm_.least_addr) goto LAB_00105fac;
          *(tbinptr *)pcVar16 = pmVar14;
          pmVar14->parent = pmVar8;
          pmVar14->bk = pmVar14;
          pmVar14->fd = pmVar14;
          pmVar5 = pmVar8;
        }
        pmVar8 = pmVar5;
        lVar12 = lVar12 * 2;
      } while (pmVar3 != (malloc_tree_chunk *)0x0);
    }
  }
LAB_00105ce8:
  uVar19 = uVar19 + 1;
  pmVar11 = pmVar1;
  pmVar17 = pmVar18;
  if (pmVar1 == (malloc_segment *)0x0) goto LAB_00105f81;
  goto LAB_00105c49;
}

Assistant:

static size_t release_unused_segments(mstate m) {
  size_t released = 0;
  int nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char* base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    ++nsegs;
    if (is_mmapped_segment(sp) && !is_extern_segment(sp)) {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!is_inuse(p) && (char*)p + psize >= base + size - TOP_FOOT_SIZE) {
        tchunkptr tp = (tchunkptr)p;
        assert(segment_holds(sp, (char*)sp));
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        else {
          unlink_large_chunk(m, tp);
        }
        if (CALL_MUNMAP(base, size) == 0) {
          released += size;
          m->footprint -= size;
          /* unlink obsoleted record */
          sp = pred;
          sp->next = next;
        }
        else { /* back out if cannot unmap */
          insert_large_chunk(m, tp, psize);
        }
      }
    }
    if (NO_SEGMENT_TRAVERSAL) /* scan only first segment */
      break;
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = (((size_t) nsegs > (size_t) MAX_RELEASE_CHECK_RATE)?
                       (size_t) nsegs : (size_t) MAX_RELEASE_CHECK_RATE);
  return released;
}